

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

void __thiscall PDA::Transducer::Grammar::Rule::addChains<wchar_t[12]>(Rule *this,wchar_t (*t) [12])

{
  allocator<wchar_t> local_51;
  Chain local_50;
  wstring local_30 [32];
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_30,*t,&local_51);
  std::__cxx11::wstring::wstring((wstring *)&local_50,local_30);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  emplace_back<PDA::Transducer::Grammar::Chain>(&this->m_chains,&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  std::__cxx11::wstring::~wstring(local_30);
  return;
}

Assistant:

void addChains(const T &t)
        {
            m_chains.push_back(Chain(t));
        }